

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilerbug_tests.cpp
# Opt level: O1

void __thiscall compilerbug_tests::gccbug_90348::test_method(gccbug_90348 *this)

{
  int iVar1;
  iterator in_R8;
  iterator in_R9;
  size_t __n;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  uchar in [4];
  check_type cVar2;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  uchar local_3c [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __n = 0;
  do {
    if ((uint)__n != 0) {
      memset(local_3c,0,__n);
    }
    local_50 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/compilerbug_tests.cpp"
    ;
    local_48 = "";
    local_60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x25;
    file.m_begin = (iterator)&local_50;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
    iVar1 = check_zero(local_3c,(uint)__n);
    local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         SUB41(iVar1,0);
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a8 = "check_zero(in, i)";
    local_a0 = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_88 = boost::unit_test::lazy_ostream::inst;
    local_80 = &local_a8;
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/compilerbug_tests.cpp"
    ;
    local_b0 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,&local_98,1,0,WARN,_cVar2,(size_t)&local_b8,0x25);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
    __n = __n + 1;
  } while (__n != 5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gccbug_90348) {
    // Test for GCC bug 90348. See https://gcc.gnu.org/bugzilla/show_bug.cgi?id=90348
    for (int i = 0; i <= 4; ++i) {
        unsigned char in[4];
        for (int j = 0; j < i; ++j) {
            in[j] = 0;
            set_one_on_stack(); // Apparently modifies in[0]
        }
        BOOST_CHECK(check_zero(in, i));
    }
}